

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::EnumValueDescriptor::DebugString
          (EnumValueDescriptor *this,int depth,string *contents)

{
  bool bVar1;
  size_t sVar2;
  string formatted_options;
  string prefix;
  SubstituteArg local_210;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  std::__cxx11::string::_M_construct((ulong)&prefix,(char)depth * '\x02');
  local_c0.text_ = prefix._M_dataplus._M_p;
  local_c0.size_ = (int)prefix._M_string_length;
  local_f0.text_ = (char *)**(undefined8 **)this;
  local_f0.size_ = *(int *)(*(undefined8 **)this + 1);
  local_120.text_ = FastInt32ToBuffer(*(int32 *)(this + 0x10),local_120.scratch_);
  sVar2 = strlen(local_120.text_);
  local_120.size_ = (int)sVar2;
  local_60.text_ = (char *)0x0;
  local_60.size_ = -1;
  local_90.text_ = (char *)0x0;
  local_90.size_ = -1;
  local_150.text_ = (char *)0x0;
  local_150.size_ = -1;
  local_180.text_ = (char *)0x0;
  local_180.size_ = -1;
  local_1b0.text_ = (char *)0x0;
  local_1b0.size_ = -1;
  local_1e0.text_ = (char *)0x0;
  local_1e0.size_ = -1;
  local_210.text_ = (char *)0x0;
  local_210.size_ = -1;
  strings::SubstituteAndAppend
            (contents,"$0$1 = $2",&local_c0,&local_f0,&local_120,&local_60,&local_90,&local_150,
             &local_180,&local_1b0,&local_1e0,&local_210);
  formatted_options._M_string_length = 0;
  formatted_options.field_2._M_local_buf[0] = '\0';
  formatted_options._M_dataplus._M_p = (pointer)&formatted_options.field_2;
  bVar1 = anon_unknown_1::FormatBracketedOptions
                    (depth,*(Message **)(this + 0x20),&formatted_options);
  if (bVar1) {
    local_c0.text_ = formatted_options._M_dataplus._M_p;
    local_c0.size_ = (int)formatted_options._M_string_length;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    local_1b0.text_ = (char *)0x0;
    local_1b0.size_ = -1;
    local_1e0.text_ = (char *)0x0;
    local_1e0.size_ = -1;
    local_210.text_ = (char *)0x0;
    local_210.size_ = -1;
    strings::SubstituteAndAppend
              (contents," [$0]",&local_c0,&local_f0,&local_120,&local_60,&local_90,&local_150,
               &local_180,&local_1b0,&local_1e0,&local_210);
  }
  std::__cxx11::string::append((char *)contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)formatted_options._M_dataplus._M_p != &formatted_options.field_2) {
    operator_delete(formatted_options._M_dataplus._M_p,
                    CONCAT71(formatted_options.field_2._M_allocated_capacity._1_7_,
                             formatted_options.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prefix._M_dataplus._M_p != &prefix.field_2) {
    operator_delete(prefix._M_dataplus._M_p,prefix.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void EnumValueDescriptor::DebugString(int depth, string *contents) const {
  string prefix(depth * 2, ' ');
  strings::SubstituteAndAppend(contents, "$0$1 = $2",
                               prefix, name(), number());

  string formatted_options;
  if (FormatBracketedOptions(depth, options(), &formatted_options)) {
    strings::SubstituteAndAppend(contents, " [$0]", formatted_options);
  }
  contents->append(";\n");
}